

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

String * __thiscall
Json::writeString_abi_cxx11_(String *__return_storage_ptr__,Json *this,Factory *factory,Value *root)

{
  long *plVar1;
  OStringStream sout;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  plVar1 = (long *)(**(code **)(*(long *)this + 0x10))(this);
  (**(code **)(*plVar1 + 0x10))(plVar1,factory,local_190);
  std::__cxx11::stringbuf::str();
  (**(code **)(*plVar1 + 8))(plVar1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

String writeString(StreamWriter::Factory const& factory, Value const& root) {
  OStringStream sout;
  StreamWriterPtr const writer(factory.newStreamWriter());
  writer->write(root, &sout);
  return std::move(sout).str();
}